

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionSkipBytes.cpp
# Opt level: O0

void __thiscall Hpipe::InstructionSkipBytes::get_code_repr(InstructionSkipBytes *this,ostream *os)

{
  ostream *poVar1;
  ulong uVar2;
  ostream *os_local;
  InstructionSkipBytes *this_local;
  
  poVar1 = std::operator<<(os,"SKIP_BYTES ");
  uVar2 = std::__cxx11::string::size();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1," ");
  std::operator<<(poVar1,(string *)&this->var);
  return;
}

Assistant:

void InstructionSkipBytes::get_code_repr( std::ostream &os ) {
    os << "SKIP_BYTES " << var.size() << " " << var;
}